

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Padding_x86::forward_int8(Padding_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  size_t sVar1;
  undefined8 uVar2;
  void *pvVar3;
  int iVar4;
  undefined4 uVar5;
  undefined1 uVar6;
  undefined1 uVar8;
  undefined1 uVar10;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar16;
  undefined1 uVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  uint uVar23;
  ulong uVar25;
  ulong uVar26;
  undefined8 *puVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int x;
  int iVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  uint uVar35;
  undefined8 *puVar36;
  undefined8 *puVar37;
  uint uVar38;
  undefined8 *puVar39;
  ulong uVar40;
  int iVar41;
  long lVar42;
  int z;
  ulong uVar43;
  bool bVar44;
  Mat m;
  Mat m_1;
  undefined4 uVar7;
  undefined3 uVar9;
  undefined2 uVar11;
  undefined3 uVar15;
  undefined2 uVar17;
  ulong uVar24;
  
  m.w = bottom_blob->w;
  m.h = bottom_blob->h;
  iVar19 = bottom_blob->d;
  uVar35 = bottom_blob->c;
  uVar21 = (ulong)uVar35;
  m.elemsize = bottom_blob->elemsize;
  m.elempack = bottom_blob->elempack;
  m.dims = bottom_blob->dims;
  if (m.elempack == 8) {
    switch(m.dims) {
    case 1:
      uVar23 = (this->super_Padding).left;
      if ((((uVar23 & 7) == 0) &&
          (uVar23 = uVar23 + m.w * 8 + (this->super_Padding).right, (uVar23 & 7) == 0)) &&
         ((this->super_Padding).type == 0)) {
        Mat::create(top_blob,(int)uVar23 >> 3,m.elemsize & 0xfffffffffffffff8,8,opt->blob_allocator)
        ;
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        uVar21 = (ulong)(this->super_Padding).value;
        padding_constant_pack8_int8_sse
                  (bottom_blob,top_blob,0,0,(this->super_Padding).left / 8,
                   (this->super_Padding).right / 8,
                   uVar21 << 0x38 | uVar21 << 0x30 | uVar21 << 0x28 |
                   uVar21 << 0x20 | uVar21 << 0x18 | uVar21 << 0x10 | uVar21 << 8 | uVar21);
        return 0;
      }
      break;
    case 2:
      uVar23 = (this->super_Padding).top;
      if ((((uVar23 & 7) == 0) &&
          (uVar23 = uVar23 + m.h * 8 + (this->super_Padding).bottom, (uVar23 & 7) == 0)) &&
         ((this->super_Padding).type == 0)) {
        Mat::create(top_blob,m.w + (this->super_Padding).left + (this->super_Padding).right,
                    (int)uVar23 >> 3,m.elemsize & 0xfffffffffffffff8,8,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        uVar21 = (ulong)(this->super_Padding).value;
        padding_constant_pack8_int8_sse
                  (bottom_blob,top_blob,(this->super_Padding).top / 8,
                   (this->super_Padding).bottom / 8,(this->super_Padding).left,
                   (this->super_Padding).right,
                   uVar21 << 0x38 | uVar21 << 0x30 | uVar21 << 0x28 |
                   uVar21 << 0x20 | uVar21 << 0x18 | uVar21 << 0x10 | uVar21 << 8 | uVar21);
        return 0;
      }
      break;
    case 3:
      uVar23 = (this->super_Padding).front;
      uVar38 = uVar23 + uVar35 * 8 + (this->super_Padding).behind;
      bVar44 = (uVar38 & 7) == 0;
      if (bVar44 && (uVar23 & 7) == 0) {
        if ((uVar38 == uVar35 * 8) || ((this->super_Padding).type == 0)) {
          uVar38 = (int)uVar38 >> 3;
          Mat::create(top_blob,(this->super_Padding).left + m.w + (this->super_Padding).right,
                      (this->super_Padding).top + m.h + (this->super_Padding).bottom,uVar38,
                      (m.elemsize >> 3) << bVar44 * '\x03',8,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep == 0) {
            return -100;
          }
          uVar21 = (long)(this->super_Padding).front / -8;
          uVar24 = uVar21 & 0xffffffff;
          if ((int)uVar38 < 1) {
            uVar38 = 0;
          }
          for (uVar40 = 0; uVar40 != uVar38; uVar40 = uVar40 + 1) {
            m.w = top_blob->w;
            m.h = top_blob->h;
            pvVar3 = top_blob->data;
            m.elemsize = top_blob->elemsize;
            sVar1 = top_blob->cstep;
            puVar27 = (undefined8 *)(sVar1 * uVar40 * m.elemsize + (long)pvVar3);
            m.elempack = top_blob->elempack;
            m.allocator = top_blob->allocator;
            m.refcount = (int *)0x0;
            m.c = top_blob->d;
            m.d = 1;
            m.dims = top_blob->dims + -1;
            m.cstep = (m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / m.elemsize;
            if (top_blob->dims == 4) {
              m.cstep = (long)m.h * (long)m.w;
            }
            uVar20 = (ulong)(this->super_Padding).value;
            uVar20 = uVar20 << 0x38 | uVar20 << 0x30 | uVar20 << 0x28 |
                     uVar20 << 0x20 | uVar20 << 0x18 | uVar20 << 0x10 | uVar20 << 8 | uVar20;
            uVar23 = (int)uVar21 + (int)uVar40;
            if ((int)uVar23 < 0 || (int)uVar35 <= (int)uVar23) {
              uVar23 = top_blob->d * (int)m.cstep;
              if ((int)uVar23 < 1) {
                uVar23 = 0;
              }
              for (uVar43 = 0; uVar23 != uVar43; uVar43 = uVar43 + 1) {
                *(ulong *)((long)pvVar3 + uVar43 * 8 + sVar1 * m.elemsize * uVar40) = uVar20;
              }
            }
            else {
              iVar19 = bottom_blob->w;
              lVar34 = (long)iVar19;
              iVar41 = bottom_blob->h;
              m_1.c = bottom_blob->d;
              pvVar3 = bottom_blob->data;
              uVar43 = bottom_blob->elemsize;
              sVar1 = bottom_blob->cstep;
              puVar39 = (undefined8 *)(uVar23 * sVar1 * uVar43 + (long)pvVar3);
              m_1.allocator = bottom_blob->allocator;
              m_1.refcount = (int *)0x0;
              m_1.elempack = bottom_blob->elempack;
              m_1.d = 1;
              m_1.dims = bottom_blob->dims + -1;
              m_1.cstep = (uVar43 * iVar41 * lVar34 + 0xf & 0xfffffffffffffff0) / uVar43;
              if (bottom_blob->dims == 4) {
                m_1.cstep = iVar41 * lVar34;
              }
              iVar31 = (this->super_Padding).type;
              m_1.w = iVar19;
              if (iVar31 == 0) {
                m.data = puVar27;
                m_1.data = puVar39;
                m_1.elemsize = uVar43;
                m_1.h = iVar41;
                padding_constant_pack8_int8_sse
                          (&m_1,&m,(this->super_Padding).top,(this->super_Padding).bottom,
                           (this->super_Padding).left,(this->super_Padding).right,uVar20);
                iVar31 = (this->super_Padding).type;
              }
              if (iVar31 == 2) {
                iVar31 = (this->super_Padding).top;
                uVar23 = (this->super_Padding).left;
                lVar32 = (long)(int)uVar23;
                uVar25 = 0;
                uVar20 = 0;
                if (0 < (int)uVar23) {
                  uVar20 = (ulong)uVar23;
                }
                iVar28 = 0;
                if (0 < iVar19) {
                  iVar28 = iVar19;
                }
                uVar23 = (this->super_Padding).right;
                uVar26 = (ulong)uVar23;
                if ((int)uVar23 < 1) {
                  uVar26 = uVar25;
                }
                iVar29 = iVar31;
                if (iVar31 < 1) {
                  iVar29 = 0;
                }
                puVar39 = puVar39 + iVar31 * iVar19;
                iVar22 = (this->super_Padding).bottom;
                lVar42 = (long)pvVar3 +
                         sVar1 * uVar43 * uVar24 + lVar32 * 8 + (long)(iVar31 * iVar19) * 8;
                for (; (int)uVar25 != iVar29; uVar25 = (ulong)((int)uVar25 + 1)) {
                  for (lVar33 = 0; -lVar33 != uVar20; lVar33 = lVar33 + -1) {
                    *puVar27 = *(undefined8 *)(lVar42 + lVar33 * 8);
                    puVar27 = puVar27 + 1;
                  }
                  puVar37 = puVar39;
                  for (iVar31 = 0; iVar31 != iVar28; iVar31 = iVar31 + 1) {
                    uVar2 = *puVar37;
                    puVar37 = puVar37 + 1;
                    *puVar27 = uVar2;
                    puVar27 = puVar27 + 1;
                  }
                  for (lVar33 = 0; -lVar33 != uVar26; lVar33 = lVar33 + -1) {
                    *puVar27 = puVar37[lVar33 + -2];
                    puVar27 = puVar27 + 1;
                  }
                  puVar39 = puVar39 + -lVar34;
                  lVar42 = lVar42 + lVar34 * -8;
                }
                iVar29 = 0;
                iVar31 = 0;
                if (0 < iVar41) {
                  iVar31 = iVar41;
                }
                for (; iVar29 != iVar31; iVar29 = iVar29 + 1) {
                  for (lVar42 = 0; -lVar42 != uVar20; lVar42 = lVar42 + -1) {
                    *puVar27 = puVar39[lVar32 + lVar42];
                    puVar27 = puVar27 + 1;
                  }
                  for (iVar41 = 0; iVar41 != iVar28; iVar41 = iVar41 + 1) {
                    uVar2 = *puVar39;
                    puVar39 = puVar39 + 1;
                    *puVar27 = uVar2;
                    puVar27 = puVar27 + 1;
                  }
                  for (lVar42 = 0; -lVar42 != uVar26; lVar42 = lVar42 + -1) {
                    *puVar27 = puVar39[lVar42 + -2];
                    puVar27 = puVar27 + 1;
                  }
                }
                puVar37 = puVar39 + -(long)(iVar19 * 2);
                iVar41 = 0;
                if (iVar22 < 1) {
                  iVar22 = 0;
                }
                puVar39 = puVar39 + (lVar32 - iVar19 * 2);
                for (; iVar41 != iVar22; iVar41 = iVar41 + 1) {
                  for (lVar32 = 0; -lVar32 != uVar20; lVar32 = lVar32 + -1) {
                    *puVar27 = puVar39[lVar32];
                    puVar27 = puVar27 + 1;
                  }
                  puVar36 = puVar37;
                  for (iVar19 = 0; iVar19 != iVar28; iVar19 = iVar19 + 1) {
                    uVar2 = *puVar36;
                    puVar36 = puVar36 + 1;
                    *puVar27 = uVar2;
                    puVar27 = puVar27 + 1;
                  }
                  for (lVar32 = 0; -lVar32 != uVar26; lVar32 = lVar32 + -1) {
                    *puVar27 = puVar36[lVar32 + -2];
                    puVar27 = puVar27 + 1;
                  }
                  puVar37 = puVar37 + -lVar34;
                  puVar39 = puVar39 + -lVar34;
                }
              }
              else if (iVar31 == 1) {
                iVar31 = (this->super_Padding).left;
                iVar29 = 0;
                iVar28 = 0;
                if (iVar31 < 1) {
                  iVar31 = iVar28;
                }
                if (iVar19 < 1) {
                  iVar19 = iVar28;
                }
                iVar22 = (this->super_Padding).right;
                if (iVar22 < 1) {
                  iVar22 = iVar28;
                }
                iVar30 = (this->super_Padding).top;
                if (iVar30 < 1) {
                  iVar30 = iVar28;
                }
                iVar28 = (this->super_Padding).bottom;
                lVar34 = sVar1 * uVar43 * uVar24;
                for (; iVar4 = iVar31, iVar29 != iVar30; iVar29 = iVar29 + 1) {
                  while (iVar4 != 0) {
                    *puVar27 = *puVar39;
                    puVar27 = puVar27 + 1;
                    iVar4 = iVar4 + -1;
                  }
                  for (lVar32 = 0; iVar4 = iVar22, iVar19 != (int)lVar32; lVar32 = lVar32 + 1) {
                    *puVar27 = *(undefined8 *)((long)pvVar3 + lVar32 * 8 + lVar34);
                    puVar27 = puVar27 + 1;
                  }
                  while (iVar4 != 0) {
                    *puVar27 = *(undefined8 *)((long)pvVar3 + lVar32 * 8 + lVar34 + -8);
                    puVar27 = puVar27 + 1;
                    iVar4 = iVar4 + -1;
                  }
                }
                iVar19 = 0;
                if (0 < m_1.w) {
                  iVar19 = m_1.w;
                }
                iVar29 = 0;
                iVar30 = 0;
                if (0 < iVar41) {
                  iVar29 = 0;
                  iVar30 = iVar41;
                }
                for (; iVar41 = iVar31, iVar29 != iVar30; iVar29 = iVar29 + 1) {
                  while (iVar41 != 0) {
                    *puVar27 = *puVar39;
                    puVar27 = puVar27 + 1;
                    iVar41 = iVar41 + -1;
                  }
                  lVar32 = 0;
                  for (lVar34 = 0; iVar19 != (int)lVar34; lVar34 = lVar34 + 1) {
                    puVar27[lVar34] = puVar39[lVar34];
                    lVar32 = lVar32 + -8;
                  }
                  puVar27 = (undefined8 *)((long)puVar27 - lVar32);
                  iVar41 = iVar22;
                  while (bVar44 = iVar41 != 0, iVar41 = iVar41 + -1, bVar44) {
                    *puVar27 = puVar39[lVar34 + -1];
                    puVar27 = puVar27 + 1;
                  }
                  puVar39 = (undefined8 *)((long)puVar39 - lVar32);
                }
                puVar39 = puVar39 + -(long)m_1.w;
                iVar41 = 0;
                if (iVar28 < 1) {
                  iVar28 = iVar41;
                }
                for (; iVar29 = iVar31, iVar41 != iVar28; iVar41 = iVar41 + 1) {
                  while (iVar29 != 0) {
                    *puVar27 = *puVar39;
                    puVar27 = puVar27 + 1;
                    iVar29 = iVar29 + -1;
                  }
                  for (lVar34 = 0; iVar29 = iVar22, iVar19 != (int)lVar34; lVar34 = lVar34 + 1) {
                    *puVar27 = puVar39[lVar34];
                    puVar27 = puVar27 + 1;
                  }
                  while (iVar29 != 0) {
                    *puVar27 = puVar39[lVar34 + -1];
                    puVar27 = puVar27 + 1;
                    iVar29 = iVar29 + -1;
                  }
                }
              }
            }
            uVar24 = (ulong)((int)uVar24 + 1);
          }
          return 0;
        }
      }
      break;
    case 4:
      if ((this->super_Padding).type == 0) {
        uVar23 = (this->super_Padding).front + iVar19 + (this->super_Padding).behind;
        uVar24 = (ulong)uVar23;
        Mat::create(top_blob,m.w + (this->super_Padding).left + (this->super_Padding).right,
                    m.h + (this->super_Padding).top + (this->super_Padding).bottom,uVar23,uVar35,
                    m.elemsize,8,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        if ((int)uVar23 < 1) {
          uVar24 = 0;
        }
        if ((int)uVar35 < 1) {
          uVar21 = 0;
        }
        for (uVar40 = 0; uVar40 != uVar21; uVar40 = uVar40 + 1) {
          uVar20 = (ulong)(this->super_Padding).value;
          uVar20 = uVar20 << 0x38 | uVar20 << 0x30 | uVar20 << 0x28 |
                   uVar20 << 0x20 | uVar20 << 0x18 | uVar20 << 0x10 | uVar20 << 8 | uVar20;
          for (uVar43 = 0; uVar43 != uVar24; uVar43 = uVar43 + 1) {
            m.w = top_blob->w;
            m.h = top_blob->h;
            pvVar3 = top_blob->data;
            m.elemsize = top_blob->elemsize;
            lVar34 = top_blob->cstep * uVar40;
            m.elempack = top_blob->elempack;
            m.cstep = (long)m.h * (long)m.w;
            m.data = (void *)((long)pvVar3 + uVar43 * m.elemsize * m.cstep + lVar34 * m.elemsize);
            m.allocator = top_blob->allocator;
            m.refcount = (int *)0x0;
            m.dims = 2;
            m.d = 1;
            m.c = 1;
            uVar35 = (int)uVar43 - (this->super_Padding).front;
            if ((int)uVar35 < 0 || iVar19 <= (int)uVar35) {
              uVar25 = m.cstep & 0xffffffff;
              if ((int)m.cstep < 1) {
                uVar25 = 0;
              }
              for (uVar26 = 0; uVar25 != uVar26; uVar26 = uVar26 + 1) {
                *(ulong *)((long)pvVar3 +
                          uVar26 * 8 + m.elemsize * ((long)m.h * uVar43 * (long)m.w + lVar34)) =
                     uVar20;
              }
            }
            else {
              m_1.h = bottom_blob->h;
              m_1.elemsize = bottom_blob->elemsize;
              m_1.allocator = bottom_blob->allocator;
              m_1.cstep = (long)m_1.h * (long)bottom_blob->w;
              m_1.data = (void *)((long)bottom_blob->data +
                                 uVar35 * m_1.elemsize * m_1.cstep +
                                 bottom_blob->cstep * uVar40 * m_1.elemsize);
              m_1.refcount = (int *)0x0;
              m_1.elempack = bottom_blob->elempack;
              m_1.w = bottom_blob->w;
              m_1.dims = 2;
              m_1.d = 1;
              m_1.c = 1;
              padding_constant_pack8_int8_sse
                        (&m_1,&m,(this->super_Padding).top,(this->super_Padding).bottom,
                         (this->super_Padding).left,(this->super_Padding).right,uVar20);
            }
          }
        }
        return 0;
      }
    }
  }
  m.data = bottom_blob->data;
  m.refcount = bottom_blob->refcount;
  m.allocator = bottom_blob->allocator;
  m.cstep = bottom_blob->cstep;
  if (m.refcount != (int *)0x0) {
    LOCK();
    *m.refcount = *m.refcount + 1;
    UNLOCK();
  }
  m.d = iVar19;
  m.c = uVar35;
  if (m.elempack != 1) {
    m_1.data = *(void **)opt;
    m_1.elemsize = (size_t)opt->workspace_allocator;
    m_1.elempack = opt->openmp_blocktime;
    m_1._28_1_ = opt->use_winograd_convolution;
    m_1._29_1_ = opt->use_sgemm_convolution;
    m_1._30_1_ = opt->use_int8_inference;
    m_1._31_1_ = opt->use_vulkan_compute;
    m_1.allocator = *(Allocator **)&opt->use_bf16_storage;
    m_1._40_8_ = *(undefined8 *)&opt->vulkan_device_index;
    uVar5 = opt->flush_denormals;
    uVar6 = opt->use_local_pool_allocator;
    uVar8 = opt->use_shader_local_memory;
    uVar10 = opt->use_cooperative_matrix;
    uVar12 = opt->use_winograd23_convolution;
    uVar11 = CONCAT11(uVar12,uVar10);
    uVar9 = CONCAT21(uVar11,uVar8);
    uVar7 = CONCAT31(uVar9,uVar6);
    uVar2._0_1_ = opt->use_winograd43_convolution;
    uVar2._1_1_ = opt->use_winograd63_convolution;
    uVar2._2_1_ = opt->use_a53_a55_optimized_kernel;
    uVar2._3_1_ = opt->use_fp16_uniform;
    uVar13 = opt->use_int8_uniform;
    uVar14 = opt->use_reserved_9;
    uVar16 = opt->use_reserved_10;
    uVar18 = opt->use_reserved_11;
    uVar17 = CONCAT11(uVar18,uVar16);
    uVar15 = CONCAT21(uVar17,uVar14);
    uVar2._4_4_ = CONCAT31(uVar15,uVar13);
    m_1.c = (int)uVar2;
    m_1.refcount = (int *)opt->workspace_allocator;
    m_1.h = uVar5;
    m_1.d = uVar7;
    m_1._60_4_ = uVar2._4_4_;
    convert_packing(bottom_blob,&m,1,(Option *)&m_1);
    if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
      iVar19 = -100;
      goto LAB_003bdd7a;
    }
  }
  iVar19 = Padding::forward(&this->super_Padding,&m,top_blob,opt);
LAB_003bdd7a:
  if (m.refcount != (int *)0x0) {
    LOCK();
    *m.refcount = *m.refcount + -1;
    UNLOCK();
    if (*m.refcount == 0) {
      if (m.allocator == (Allocator *)0x0) {
        free(m.data);
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar19;
}

Assistant:

int Padding_x86::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill<int64_t>(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_int8_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_int8_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill<int64_t>(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
        if (bottom_blob_unpacked.empty())
            return -100;
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}